

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

char32_t *
fmt::v8::detail::
parse_precision<char32_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char32_t>>&>
          (char32_t *begin,char32_t *end,
          specs_checker<fmt::v8::detail::specs_handler<char32_t>_> *handler)

{
  int iVar1;
  char32_t *begin_00;
  char32_t *local_58;
  precision_adapter local_50;
  undefined1 local_48 [40];
  
  local_58 = begin + 1;
  if (local_58 != end) {
    if ((uint)(*local_58 + L'\xffffffd0') < 10) {
      iVar1 = parse_nonnegative_int<char32_t>(&local_58,end,-1);
      if (iVar1 == -1) {
        fmt::v8::detail::throw_format_error("number is too big");
      }
      ((handler->super_specs_handler<char32_t>).super_specs_setter<char32_t>.specs_)->precision =
           iVar1;
    }
    else {
      if (*local_58 != L'{') goto LAB_00170627;
      begin_00 = begin + 2;
      if (begin_00 != end) {
        local_50.handler = handler;
        if ((*begin_00 == L':') || (*begin_00 == L'}')) {
          specs_handler<char32_t>::get_arg(local_48,&handler->super_specs_handler<char32_t>);
          iVar1 = get_dynamic_spec<fmt::v8::detail::precision_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t>>,fmt::v8::detail::error_handler>
                            ();
          ((handler->super_specs_handler<char32_t>).super_specs_setter<char32_t>.specs_)->precision
               = iVar1;
        }
        else {
          begin_00 = do_parse_arg_id<char32_t,fmt::v8::detail::parse_precision<char32_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char32_t>>&>(char32_t_const*,char32_t_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char32_t>>&)::precision_adapter&>
                               (begin_00,end,&local_50);
        }
      }
      if ((begin_00 == end) || (local_58 = begin_00 + 1, *begin_00 != L'}')) {
        fmt::v8::detail::throw_format_error("invalid format string");
      }
    }
    if ((handler->arg_type_ < custom_type) && ((0x41feU >> (handler->arg_type_ & 0x1f) & 1) != 0)) {
      fmt::v8::detail::throw_format_error("precision not allowed for this argument type");
    }
    return local_58;
  }
LAB_00170627:
  fmt::v8::detail::throw_format_error("missing precision specifier");
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}